

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall QGraphicsScenePrivate::_q_processDirtyItems(QGraphicsScenePrivate *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  QGraphicsItem **ppQVar4;
  QGraphicsView **ppQVar5;
  long lVar6;
  bool bVar7;
  QWidgetPrivate *this_00;
  QWidget *this_01;
  long lVar8;
  long in_FS_OFFSET;
  QRectF local_68;
  void *local_48;
  QRectF *pQStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(uint *)&this->field_0xb8;
  *(uint *)&this->field_0xb8 = uVar1 & 0xffffffef;
  if ((uVar1 & 4) == 0) {
    local_68.xp = (this->growingItemsBoundingRect).xp;
    local_68.yp = (this->growingItemsBoundingRect).yp;
    local_68.w = (this->growingItemsBoundingRect).w;
    local_68.h = (this->growingItemsBoundingRect).h;
    lVar3 = (this->topLevelItems).d.size;
    if (lVar3 != 0) {
      ppQVar4 = (this->topLevelItems).d.ptr;
      lVar8 = 0;
      do {
        processDirtyItemsRecursive(this,*(QGraphicsItem **)((long)ppQVar4 + lVar8),false,1.0);
        lVar8 = lVar8 + 8;
      } while (lVar3 << 3 != lVar8);
    }
    uVar2 = *(uint *)&this->field_0xb8;
    *(uint *)&this->field_0xb8 = uVar2 & 0xfffffffd;
    if ((uVar2 & 1) == 0) {
      bVar7 = comparesEqual(&local_68,&this->growingItemsBoundingRect);
      if (!bVar7) {
        local_48 = (void *)0x0;
        pQStack_40 = &this->growingItemsBoundingRect;
        QMetaObject::activate
                  (*(QObject **)&this->field_0x8,&QGraphicsScene::staticMetaObject,1,&local_48);
      }
    }
    if ((uVar1 & 8) == 0) {
      lVar3 = (this->views).d.size;
      if (lVar3 != 0) {
        ppQVar5 = (this->views).d.ptr;
        lVar8 = 0;
        do {
          QGraphicsViewPrivate::processPendingUpdates
                    (*(QGraphicsViewPrivate **)(*(long *)((long)ppQVar5 + lVar8) + 8));
          lVar8 = lVar8 + 8;
        } while (lVar3 << 3 != lVar8);
      }
      if ((this->field_0xb8 & 8) != 0) {
        _q_emitUpdated(this);
      }
      lVar3 = (this->views).d.size;
      if (lVar3 != 0) {
        ppQVar5 = (this->views).d.ptr;
        lVar8 = 0;
        do {
          lVar6 = *(long *)(*(long *)((long)ppQVar5 + lVar8) + 8);
          this_00 = qt_widget_private(*(QWidget **)(lVar6 + 0x2b0));
          bVar7 = QWidgetPrivate::shouldPaintOnScreen(this_00);
          this_01 = *(QWidget **)(lVar6 + 0x2b0);
          if (!bVar7) {
            this_01 = QWidget::window(this_01);
          }
          QCoreApplication::sendPostedEvents(&this_01->super_QObject,0x4d);
          lVar8 = lVar8 + 8;
        } while (lVar3 << 3 != lVar8);
      }
    }
  }
  else {
    lVar3 = (this->topLevelItems).d.size;
    if (lVar3 != 0) {
      ppQVar4 = (this->topLevelItems).d.ptr;
      lVar8 = 0;
      do {
        resetDirtyItem(this,*(QGraphicsItem **)((long)ppQVar4 + lVar8),true);
        lVar8 = lVar8 + 8;
      } while (lVar3 << 3 != lVar8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::_q_processDirtyItems()
{
    processDirtyItemsEmitted = false;

    if (updateAll) {
        Q_ASSERT(calledEmitUpdated);
        // No need for further processing (except resetting the dirty states).
        // The growingItemsBoundingRect is updated in _q_emitUpdated.
        for (auto topLevelItem : std::as_const(topLevelItems))
            resetDirtyItem(topLevelItem, /*recursive=*/true);
        return;
    }

    const bool wasPendingSceneUpdate = calledEmitUpdated;
    const QRectF oldGrowingItemsBoundingRect = growingItemsBoundingRect;

    // Process items recursively.
    for (auto topLevelItem : std::as_const(topLevelItems))
        processDirtyItemsRecursive(topLevelItem);

    dirtyGrowingItemsBoundingRect = false;
    if (!hasSceneRect && oldGrowingItemsBoundingRect != growingItemsBoundingRect)
        emit q_func()->sceneRectChanged(growingItemsBoundingRect);

    if (wasPendingSceneUpdate)
        return;

    for (auto view : std::as_const(views))
        view->d_func()->processPendingUpdates();

    if (calledEmitUpdated) {
        // We did a compatibility QGraphicsScene::update in processDirtyItemsRecursive
        // and we cannot wait for the control to reach the eventloop before the
        // changed signal is emitted, so we emit it now.
        _q_emitUpdated();
    }

    // Immediately dispatch all pending update requests on the views.
    for (auto view : std::as_const(views))
        view->d_func()->dispatchPendingUpdateRequests();
}